

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_value(basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
             *this,json_visitor *visitor,uint8_t type,error_code *ec)

{
  size_t *psVar1;
  string_type *buffer;
  uint8_t uVar2;
  char *first;
  int iVar3;
  bson_errc __e;
  ulong uVar4;
  byte bVar5;
  uint8_t *puVar6;
  pointer puVar7;
  _func_int **pp_Var8;
  pointer *ppuVar9;
  long lVar10;
  uint8_t *puVar11;
  uchar *puVar12;
  pointer ppVar13;
  undefined7 in_register_00000011;
  size_t length_00;
  size_t length_01;
  size_t sVar14;
  undefined8 uVar15;
  ulong uVar16;
  type_conflict4 *ptVar17;
  size_t sVar18;
  uint8_t *puVar19;
  pointer puVar20;
  ulong uVar21;
  ulong uVar22;
  type tVar23;
  decimal128_to_chars_result dVar24;
  undefined8 uStack_c0;
  uint8_t buf [8];
  pointer puStack_b0;
  uint8_t buf_4 [4];
  uint8_t auStack_a4 [4];
  undefined8 uStack_a0;
  error_code *local_90;
  ulong local_88;
  type_conflict4 length;
  undefined4 uStack_7c;
  pointer local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  parse_mode local_34;
  
  puVar6 = buf;
  ptVar17 = (type_conflict4 *)buf;
  iVar3 = (int)CONCAT71(in_register_00000011,type);
  switch(iVar3) {
  case 1:
    puVar6 = (this->source_).current_.p_;
    puVar11 = (this->source_).end_.p_;
    lVar10 = 0;
    do {
      if (puVar6 == puVar11) {
        ppuVar9 = (pointer *)(buf + lVar10);
        goto LAB_00161d3d;
      }
      buf[lVar10] = *puVar6;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 1;
      (this->source_).current_.p_ = puVar6;
    } while (lVar10 != 8);
    ppuVar9 = &puStack_b0;
LAB_00161d3d:
    lVar10 = (long)ppuVar9 - (long)buf;
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar10;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar10;
    if (lVar10 == 8) {
      (*visitor->_vptr_basic_json_visitor[0x12])(buf._0_4_,visitor,0,this,ec);
LAB_00162043:
      bVar5 = this->cursor_mode_ ^ 1;
      goto LAB_00162048;
    }
    break;
  case 3:
    begin_document(this,visitor,ec);
    return;
  case 4:
    if (*(int *)((this->options_)._vptr_bson_decode_options[-3] + 8 +
                (long)&(this->options_)._vptr_bson_decode_options) <
        (int)(((long)(this->state_stack_).
                     super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->state_stack_).
                    super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      __e = max_nesting_depth_exceeded;
      goto LAB_001617a7;
    }
    puVar6 = (this->source_).current_.p_;
    puVar11 = (this->source_).end_.p_;
    lVar10 = 0;
    do {
      if (puVar6 == puVar11) {
        puVar6 = buf_4 + lVar10;
        goto LAB_00161f67;
      }
      buf_4[lVar10] = *puVar6;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 1;
      (this->source_).current_.p_ = puVar6;
    } while (lVar10 != 4);
    puVar6 = auStack_a4;
LAB_00161f67:
    buf = (uint8_t  [8])((long)puVar6 - (long)buf_4);
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + (long)buf;
    if (buf == (uint8_t  [8])0x4) {
      _length = CONCAT44(uStack_7c,buf_4);
      (*visitor->_vptr_basic_json_visitor[6])(visitor,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      if (ec->_M_value != 0) {
        return;
      }
      local_34 = array;
      std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
      emplace_back<jsoncons::bson::parse_mode,int&,unsigned_long&>
                ((vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>> *)
                 &this->state_stack_,&local_34,&length,(unsigned_long *)buf);
      return;
    }
    goto LAB_00162073;
  case 5:
    puVar6 = (this->source_).current_.p_;
    puVar11 = (this->source_).end_.p_;
    lVar10 = 0;
    do {
      if (puVar6 == puVar11) {
        puVar19 = buf_4 + lVar10;
        goto LAB_00161bf9;
      }
      buf_4[lVar10] = *puVar6;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 1;
      (this->source_).current_.p_ = puVar6;
    } while (lVar10 != 4);
    puVar19 = auStack_a4;
LAB_00161bf9:
    lVar10 = (long)puVar19 - (long)buf_4;
    sVar18 = (this->source_).position_ + lVar10;
    (this->source_).position_ = sVar18;
    ppVar13 = (this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sVar14 = ppVar13[-1].pos + lVar10;
    ppVar13[-1].pos = sVar14;
    if (lVar10 == 4) {
      uVar16 = (ulong)(int)buf_4;
      if ((long)uVar16 < 0) {
        __e = length_is_negative;
        goto LAB_001617a7;
      }
      ptVar17 = &length;
      if (puVar6 != puVar11) {
        ptVar17 = (type_conflict4 *)((long)&length + 1);
        _length = CONCAT71(stack0xffffffffffffff81,*puVar6);
        (this->source_).current_.p_ = puVar6 + 1;
      }
      lVar10 = (long)ptVar17 - (long)&length;
      (this->source_).position_ = sVar18 + lVar10;
      sVar14 = sVar14 + lVar10;
      ppVar13[-1].pos = sVar14;
      if (lVar10 != 1) break;
      puVar20 = (this->bytes_buffer_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar20) {
        (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar20;
      }
      local_90 = ec;
      if (buf_4 != (uint8_t  [4])0x0) {
        uVar21 = 0x4000;
        local_88 = uVar16;
        if (uVar16 < 0x4000) {
          uVar21 = uVar16;
        }
        do {
          if ((this->source_).current_.p_ == (this->source_).end_.p_) {
            psVar1 = &(this->state_stack_).
                      super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
            *psVar1 = *psVar1 + (local_88 - uVar16);
            ec = local_90;
            if (uVar16 == 0) goto LAB_00162018;
            goto LAB_00162063;
          }
          puVar20 = (this->bytes_buffer_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          puVar7 = (this->bytes_buffer_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&this->bytes_buffer_,(size_type)(puVar20 + (uVar21 - (long)puVar7)));
          puVar20 = puVar20 + ((long)(this->bytes_buffer_).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)puVar7);
          puVar7 = puVar20;
          if (uVar21 != 0) {
            puVar12 = (this->source_).current_.p_;
            do {
              if (puVar12 == (this->source_).end_.p_) break;
              *puVar7 = *puVar12;
              puVar7 = puVar7 + 1;
              puVar12 = (this->source_).current_.p_ + 1;
              (this->source_).current_.p_ = puVar12;
            } while (puVar7 < puVar20 + uVar21);
          }
          psVar1 = &(this->source_).position_;
          *psVar1 = *psVar1 + ((long)puVar7 - (long)puVar20);
          uVar16 = uVar16 - ((long)puVar7 - (long)puVar20);
          uVar21 = 0x4000;
          if (uVar16 < 0x4000) {
            uVar21 = uVar16;
          }
        } while (uVar16 != 0);
        ppVar13 = (this->state_stack_).
                  super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        sVar14 = ppVar13[-1].pos;
        uVar16 = local_88;
      }
      ppVar13[-1].pos = sVar14 + uVar16;
LAB_00162018:
      buf = (uint8_t  [8])
            (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
      puStack_b0 = (this->bytes_buffer_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish + -(long)buf;
      (*visitor->_vptr_basic_json_visitor[0xe])(visitor,buf,_length & 0xff,this,local_90);
      goto LAB_00162043;
    }
LAB_00162073:
    __e = unexpected_eof;
    goto LAB_001617a7;
  case 6:
    pp_Var8 = visitor->_vptr_basic_json_visitor;
    uVar15 = 0xd;
    goto LAB_00161a7b;
  case 7:
    puVar6 = (this->source_).current_.p_;
    puVar11 = (this->source_).end_.p_;
    lVar10 = 0;
    do {
      if (puVar6 == puVar11) {
        puVar6 = buf_4 + lVar10;
        goto LAB_00161d82;
      }
      buf_4[lVar10] = *puVar6;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 1;
      (this->source_).current_.p_ = puVar6;
    } while (lVar10 != 0xc);
    puVar6 = (uint8_t *)((long)&uStack_a0 + 4);
LAB_00161d82:
    lVar10 = (long)puVar6 - (long)buf_4;
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar10;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar10;
    local_90 = ec;
    if (lVar10 == 0xc) {
      uVar22 = (ulong)_buf_4 & 0xff;
      uVar16 = (ulong)_buf_4 >> 8;
      uVar21 = (ulong)_buf_4 >> 0x10;
      uVar4 = (ulong)_buf_4 >> 0x18;
      local_70 = (ulong)_buf_4 >> 0x20 & 0xff;
      local_68 = (ulong)_buf_4 >> 0x28 & 0xff;
      local_60 = (ulong)_buf_4 >> 0x30 & 0xff;
      local_58 = (ulong)_buf_4 >> 0x38;
      local_50 = (ulong)uStack_a0 & 0xff;
      local_48 = (ulong)uStack_a0 >> 8 & 0xff;
      local_40 = (ulong)uStack_a0 >> 0x10 & 0xff;
      local_88 = (ulong)uStack_a0 >> 0x18 & 0xff;
      std::__cxx11::string::resize((ulong)&this->text_buffer_,'\x18');
      puStack_b0 = (pointer)(this->text_buffer_)._M_dataplus._M_p;
      *(undefined2 *)puStack_b0 =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            uVar22 * 2);
      *(undefined2 *)(puStack_b0 + 2) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar16 & 0xff) * 2);
      *(undefined2 *)(puStack_b0 + 4) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar21 & 0xff) * 2);
      *(undefined2 *)(puStack_b0 + 6) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar4 & 0xff) * 2);
      *(undefined2 *)(puStack_b0 + 8) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_70 * 2);
      *(undefined2 *)(puStack_b0 + 10) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_68 * 2);
      *(undefined2 *)(puStack_b0 + 0xc) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_60 * 2);
      *(undefined2 *)(puStack_b0 + 0xe) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_58 * 2);
      *(undefined2 *)(puStack_b0 + 0x10) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_50 * 2);
      *(undefined2 *)(puStack_b0 + 0x12) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_48 * 2);
      *(undefined2 *)(puStack_b0 + 0x14) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_40 * 2);
      *(undefined2 *)(puStack_b0 + 0x16) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            local_88 * 2);
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var8 = visitor->_vptr_basic_json_visitor;
      uVar15 = 0x13;
      ec = local_90;
LAB_00161eda:
      (*pp_Var8[0xc])(visitor,ptVar17,uVar15,this,ec);
      goto LAB_00162043;
    }
    break;
  case 8:
    puVar11 = (this->source_).current_.p_;
    if (puVar11 != (this->source_).end_.p_) {
      uVar2 = *puVar11;
      puVar6 = buf + 1;
      buf[0] = uVar2;
      (this->source_).current_.p_ = puVar11 + 1;
      puVar11 = (uint8_t *)(ulong)(uVar2 != '\0');
    }
    lVar10 = (long)puVar6 - (long)buf;
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar10;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar10;
    if (lVar10 == 1) {
      (*visitor->_vptr_basic_json_visitor[0xb])(visitor,(ulong)((uint)puVar11 & 1),0,this,ec);
      goto LAB_00162043;
    }
    break;
  case 9:
    puVar6 = (this->source_).current_.p_;
    puVar11 = (this->source_).end_.p_;
    lVar10 = 0;
    do {
      if (puVar6 == puVar11) {
        ppuVar9 = (pointer *)(buf + lVar10);
        goto LAB_00161bc0;
      }
      buf[lVar10] = *puVar6;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 1;
      (this->source_).current_.p_ = puVar6;
    } while (lVar10 != 8);
    ppuVar9 = &puStack_b0;
LAB_00161bc0:
    lVar10 = (long)ppuVar9 - (long)buf;
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar10;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar10;
    if (lVar10 == 8) {
      pp_Var8 = visitor->_vptr_basic_json_visitor;
      uVar15 = 6;
LAB_00161f11:
      (*pp_Var8[0x10])(visitor,buf,uVar15,this,ec);
      goto LAB_00162043;
    }
    break;
  case 10:
    pp_Var8 = visitor->_vptr_basic_json_visitor;
    uVar15 = 0;
LAB_00161a7b:
    (*pp_Var8[10])(visitor,uVar15,this,ec);
    goto LAB_00161a84;
  case 0xb:
    (this->text_buffer_)._M_string_length = 0;
    buffer = &this->text_buffer_;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    puStack_b0 = (pointer)(this->text_buffer_)._M_dataplus._M_p;
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var8 = visitor->_vptr_basic_json_visitor;
    uStack_c0 = 0x14;
    goto LAB_0016195f;
  case 0xc:
  case 0xf:
switchD_001616f4_caseD_c:
    __e = unknown_type;
    goto LAB_001617a7;
  case 0xd:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar23 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length_01);
    if (tVar23.ec == success) {
      puStack_b0 = (pointer)(this->text_buffer_)._M_dataplus._M_p;
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var8 = visitor->_vptr_basic_json_visitor;
      uStack_c0 = 0x15;
      goto LAB_0016195f;
    }
    goto LAB_0016206c;
  case 0x10:
    puVar6 = (this->source_).current_.p_;
    puVar11 = (this->source_).end_.p_;
    lVar10 = 0;
    do {
      if (puVar6 == puVar11) {
        puVar6 = buf + lVar10;
        goto LAB_00161ee6;
      }
      buf[lVar10] = *puVar6;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 1;
      (this->source_).current_.p_ = puVar6;
    } while (lVar10 != 4);
    puVar6 = buf + 4;
LAB_00161ee6:
    lVar10 = (long)puVar6 - (long)buf;
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar10;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar10;
    if (lVar10 == 4) {
      buf = (uint8_t  [8])(long)(int)buf._0_4_;
LAB_00161f09:
      pp_Var8 = visitor->_vptr_basic_json_visitor;
      uVar15 = 0;
      goto LAB_00161f11;
    }
    break;
  case 0x11:
    puVar6 = (this->source_).current_.p_;
    puVar11 = (this->source_).end_.p_;
    lVar10 = 0;
    do {
      if (puVar6 == puVar11) {
        ppuVar9 = (pointer *)(buf + lVar10);
        goto LAB_00161f26;
      }
      buf[lVar10] = *puVar6;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 1;
      (this->source_).current_.p_ = puVar6;
    } while (lVar10 != 8);
    ppuVar9 = &puStack_b0;
LAB_00161f26:
    lVar10 = (long)ppuVar9 - (long)buf;
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar10;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar10;
    if (lVar10 == 8) {
      (*visitor->_vptr_basic_json_visitor[0xf])(visitor,buf,0,this,ec);
      goto LAB_00162043;
    }
    break;
  case 0x12:
    puVar6 = (this->source_).current_.p_;
    puVar11 = (this->source_).end_.p_;
    lVar10 = 0;
    do {
      if (puVar6 == puVar11) {
        ppuVar9 = (pointer *)(buf + lVar10);
        goto LAB_00161afd;
      }
      buf[lVar10] = *puVar6;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 1;
      (this->source_).current_.p_ = puVar6;
    } while (lVar10 != 8);
    ppuVar9 = &puStack_b0;
LAB_00161afd:
    lVar10 = (long)ppuVar9 - (long)buf;
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar10;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar10;
    if (lVar10 == 8) goto LAB_00161f09;
    break;
  case 0x13:
    puVar6 = (this->source_).current_.p_;
    puVar11 = (this->source_).end_.p_;
    lVar10 = 0;
    do {
      if (puVar6 == puVar11) {
        puVar6 = buf + lVar10;
        goto LAB_00161b29;
      }
      buf[lVar10] = *puVar6;
      lVar10 = lVar10 + 1;
      puVar6 = puVar6 + 1;
      (this->source_).current_.p_ = puVar6;
    } while (lVar10 != 0x10);
    puVar6 = buf_4;
LAB_00161b29:
    lVar10 = (long)puVar6 - (long)buf;
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar10;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar10;
    if (lVar10 == 0x10) {
      buf_4[0] = buf[0];
      buf_4[1] = buf[1];
      buf_4[2] = buf[2];
      buf_4[3] = buf[3];
      auStack_a4[0] = buf[4];
      auStack_a4[1] = buf[5];
      auStack_a4[2] = buf[6];
      auStack_a4[3] = buf[7];
      uStack_a0 = puStack_b0;
      (this->text_buffer_)._M_string_length = 0;
      *(this->text_buffer_)._M_dataplus._M_p = '\0';
      std::__cxx11::string::resize((ulong)&this->text_buffer_,'*');
      first = (this->text_buffer_)._M_dataplus._M_p;
      dVar24 = decimal128_to_chars(first,first + (this->text_buffer_)._M_string_length,
                                   (decimal128_t *)buf_4);
      local_78 = (this->text_buffer_)._M_dataplus._M_p;
      _length = (long)dVar24.ptr - (long)local_78;
      ptVar17 = &length;
      pp_Var8 = visitor->_vptr_basic_json_visitor;
      uVar15 = 0xb;
      goto LAB_00161eda;
    }
    break;
  default:
    if ((iVar3 != 0x7f) && (iVar3 != 0xff)) goto switchD_001616f4_caseD_c;
  case 2:
  case 0xe:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar23 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length_00);
    if (tVar23.ec == success) {
      puStack_b0 = (pointer)(this->text_buffer_)._M_dataplus._M_p;
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var8 = visitor->_vptr_basic_json_visitor;
      uStack_c0 = 0;
LAB_0016195f:
      (*pp_Var8[0xc])(visitor,buf,uStack_c0,this,ec);
LAB_00161a84:
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      return;
    }
LAB_0016206c:
    __e = invalid_utf8_text_string;
LAB_001617a7:
    std::error_code::operator=(ec,__e);
    this->more_ = false;
    return;
  }
LAB_00162063:
  std::error_code::operator=(ec,unexpected_eof);
  bVar5 = false;
LAB_00162048:
  this->more_ = (bool)bVar5;
  return;
}

Assistant:

void read_value(json_visitor& visitor, uint8_t type, std::error_code& ec)
    {
        switch (type)
        {
            case jsoncons::bson::bson_type::double_type:
            {
                uint8_t buf[sizeof(double)]; 
                std::size_t n = source_.read(buf, sizeof(double));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(double)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                double res = binary::little_to_native<double>(buf, sizeof(buf));
                visitor.double_value(res, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::symbol_type:
            case jsoncons::bson::bson_type::min_key_type:
            case jsoncons::bson::bson_type::max_key_type:
            case jsoncons::bson::bson_type::string_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::javascript_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::code, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::regex_type:
            {
                text_buffer_.clear();
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::regex, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::document_type: 
            {
                begin_document(visitor,ec);
                break;
            }

            case jsoncons::bson::bson_type::array_type: 
            {
                begin_array(visitor,ec);
                break;
            }
            case jsoncons::bson::bson_type::undefined_type: 
                {
                    visitor.null_value(semantic_tag::undefined, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
            case jsoncons::bson::bson_type::null_type: 
            {
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::bool_type:
            {
                uint8_t c;
                std::size_t n = source_.read(&c, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                visitor.bool_value(c != 0, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int32_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::timestamp_type: 
            {
                uint8_t buf[sizeof(uint64_t)]; 
                std::size_t n = source_.read(buf, sizeof(uint64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(uint64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<uint64_t>(buf, sizeof(buf));
                visitor.uint64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::datetime_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::epoch_milli, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::binary_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                const auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
                if (JSONCONS_UNLIKELY(len < 0))
                {
                    ec = bson_errc::length_is_negative;
                    more_ = false;
                    return;
                }
                uint8_t subtype;
                n = source_.read(&subtype, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                bytes_buffer_.clear();
                n = source_reader<Source>::read(source_, bytes_buffer_, len);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != static_cast<std::size_t>(len)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                visitor.byte_string_value(bytes_buffer_, 
                                                  subtype, 
                                                  *this,
                                                  ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::decimal128_type: 
            {
                uint8_t buf[sizeof(uint64_t)*2]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                decimal128_t dec;
                dec.low = binary::little_to_native<uint64_t>(buf, sizeof(uint64_t));
                dec.high = binary::little_to_native<uint64_t>(buf+sizeof(uint64_t), sizeof(uint64_t));

                text_buffer_.clear();
                text_buffer_.resize(bson::decimal128_limits::buf_size);
                auto r = bson::decimal128_to_chars(&text_buffer_[0], &text_buffer_[0]+text_buffer_.size(), dec);
                visitor.string_value(string_view(text_buffer_.data(),static_cast<std::size_t>(r.ptr-text_buffer_.data())), semantic_tag::float128, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::object_id_type: 
            {
                uint8_t buf[12]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                oid_t oid(buf);
                to_string(oid, text_buffer_);

                visitor.string_value(text_buffer_, semantic_tag::id, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            default:
            {
                ec = bson_errc::unknown_type;
                more_ = false;
                return;
            }
        }
    }